

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

FileInfo * __thiscall efsw::FileInfo::linksTo_abi_cxx11_(FileInfo *this)

{
  bool bVar1;
  char *pcVar2;
  FileInfo *in_RSI;
  allocator local_35 [19];
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *ch;
  FileInfo *this_local;
  string *tstr;
  
  this_local = this;
  bVar1 = isLink(in_RSI);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = realpath(pcVar2,(char *)0x0);
    if (pcVar2 != (char *)0x0) {
      local_21 = 0;
      local_20 = pcVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar2,&local_22);
      std::allocator<char>::~allocator((allocator<char> *)&local_22);
      free(local_20);
      return this;
    }
    local_20 = (char *)0x0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  return this;
}

Assistant:

std::string FileInfo::linksTo() {
#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	if ( isLink() ) {
		char* ch = realpath( Filepath.c_str(), NULL );

		if ( NULL != ch ) {
			std::string tstr( ch );

			free( ch );

			return tstr;
		}
	}
#endif
	return std::string( "" );
}